

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

am_loc_values * create_loc_values(Am_Inter_Location *current_loc,Am_Value *old_val)

{
  bool bVar1;
  am_loc_values *this;
  ostream *poVar2;
  bool as_line;
  Am_Object oref_obj;
  int ob;
  int oa;
  int d;
  int c;
  int b;
  int a;
  Am_Inter_Location old_loc;
  Am_Object ref_obj;
  int od;
  int oc;
  
  this = (am_loc_values *)operator_new(0x60);
  am_loc_values::am_loc_values(this);
  ref_obj.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location(current_loc,&as_line,&ref_obj,&a,&b,&c,&d);
  if (as_line != true) {
    Am_Inter_Location::operator=(&this->orig_value,current_loc);
    bVar1 = Am_Inter_Location::Get_Growing(current_loc);
    this->growing = bVar1;
    this->left_equals = a;
    this->top_equals = b;
    this->width_equals = c;
    this->height_equals = d;
    bVar1 = Am_Value::Valid(old_val);
    if (bVar1) {
      bVar1 = Am_Inter_Location::Test(old_val);
      if (bVar1) {
        oref_obj.data = (Am_Object_Data *)0x0;
        Am_Inter_Location::Am_Inter_Location(&old_loc,old_val);
        Am_Inter_Location::Get_Location(&old_loc,&as_line,&oref_obj,&oa,&ob,&oc,&od);
        if (as_line == true) {
          poVar2 = std::operator<<((ostream *)&std::cout,"**old value is as line ");
          poVar2 = operator<<(poVar2,&old_loc);
          std::endl<char,std::char_traits<char>>(poVar2);
          std::ostream::flush();
        }
        else {
          bVar1 = Am_Object::operator!=(&oref_obj,&ref_obj);
          if (bVar1) {
            Am_Translate_Coordinates(&oref_obj,oa,ob,&ref_obj,&oa,&ob);
          }
          this->left_offset = a - oa;
          this->top_offset = b - ob;
          this->width_offset = c - oc;
          this->height_offset = d - od;
        }
        Am_Inter_Location::~Am_Inter_Location(&old_loc);
        Am_Object::~Am_Object(&oref_obj);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"**Old val not an inter location ");
        poVar2 = operator<<(poVar2,old_val);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ostream::flush();
      }
    }
    Am_Object::~Am_Object(&ref_obj);
    return this;
  }
  Am_Error("Shouldn\'t be as_line");
}

Assistant:

am_loc_values *
create_loc_values(Am_Inter_Location &current_loc, Am_Value &old_val)
{
  am_loc_values *ret = new am_loc_values();
  bool as_line;
  int a, b, c, d;
  Am_Object ref_obj;
  current_loc.Get_Location(as_line, ref_obj, a, b, c, d);
  if (as_line)
    Am_Error("Shouldn't be as_line");
  ret->orig_value = current_loc;
  ret->growing = current_loc.Get_Growing();
  ret->left_equals = a;
  ret->top_equals = b;
  ret->width_equals = c;
  ret->height_equals = d;
  if (old_val.Valid()) {
    if (Am_Inter_Location::Test(old_val)) {
      int oa, ob, oc, od;
      Am_Object oref_obj;
      Am_Inter_Location old_loc = old_val;
      old_loc.Get_Location(as_line, oref_obj, oa, ob, oc, od);
      if (as_line) {
        std::cout << "**old value is as line " << old_loc << std::endl
                  << std::flush;
      } else {
        if (oref_obj != ref_obj)
          Am_Translate_Coordinates(oref_obj, oa, ob, ref_obj, oa, ob);
        ret->left_offset = a - oa;
        ret->top_offset = b - ob;
        ret->width_offset = c - oc;
        ret->height_offset = d - od;
      }
    } else {
      std::cout << "**Old val not an inter location " << old_val << std::endl
                << std::flush;
    }
  }
  return ret;
}